

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O1

void * rw::matfxOpen(void *o,int32 param_2,int32 param_3)

{
  Pipeline *pPVar1;
  long lVar2;
  
  _DAT_0014a298 = ObjPipeline::create();
  pPVar1 = &_DAT_0014a298->super_Pipeline;
  (_DAT_0014a298->super_Pipeline).pluginID = 0;
  pPVar1->pluginData = 0;
  lVar2 = 1;
  do {
    *(ObjPipeline **)(&matFXGlobals + lVar2 * 2) = _DAT_0014a298;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xe);
  return o;
}

Assistant:

static void*
matfxOpen(void *o, int32, int32)
{
	// init dummy pipelines
	matFXGlobals.dummypipe = ObjPipeline::create();
	matFXGlobals.dummypipe->pluginID = 0; //ID_MATFX;
	matFXGlobals.dummypipe->pluginData = 0;
	for(uint i = 0; i < nelem(matFXGlobals.pipelines); i++)
		matFXGlobals.pipelines[i] = matFXGlobals.dummypipe;
	return o;
}